

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

UserData * __thiscall luna::GC::NewUserData(GC *this,GCGeneration gen)

{
  UserData *obj;
  
  obj = (UserData *)operator_new(0x38);
  (obj->super_GCObject).next_ = (GCObject *)0x0;
  (obj->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__UserData_001546e8;
  obj->user_data_ = (void *)0x0;
  obj->metatable_ = (Table *)0x0;
  *(undefined8 *)((long)&obj->metatable_ + 1) = 0;
  *(undefined8 *)((long)&obj->destroyer_ + 1) = 0;
  (obj->super_GCObject).field_0x10 = 0x60;
  SetObjectGen(this,(GCObject *)obj,gen);
  return obj;
}

Assistant:

UserData * GC::NewUserData(GCGeneration gen)
    {
        auto u = new UserData;
        u->gc_obj_type_ = GCObjectType_UserData;
        SetObjectGen(u, gen);
        return u;
    }